

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O3

int EVP_HPKE_CTX_setup_recipient
              (EVP_HPKE_CTX *ctx,EVP_HPKE_KEY *key,EVP_HPKE_KDF *kdf,EVP_HPKE_AEAD *aead,
              uint8_t *enc,size_t enc_len,uint8_t *info,size_t info_len)

{
  EVP_HPKE_KEM *pEVar1;
  int iVar2;
  size_t local_60;
  uint8_t local_58 [40];
  
  memset(ctx,0,0x2c8);
  EVP_AEAD_CTX_zero(&ctx->aead_ctx);
  ctx->is_sender = 0;
  pEVar1 = key->kem;
  ctx->kem = pEVar1;
  ctx->kdf = kdf;
  ctx->aead = aead;
  iVar2 = (*pEVar1->decap)(key,local_58,&local_60,enc,enc_len);
  if ((iVar2 != 0) &&
     (iVar2 = hpke_key_schedule(ctx,'\0',local_58,local_60,info,info_len), iVar2 != 0)) {
    return 1;
  }
  EVP_AEAD_CTX_cleanup(&ctx->aead_ctx);
  return 0;
}

Assistant:

int EVP_HPKE_CTX_setup_recipient(EVP_HPKE_CTX *ctx, const EVP_HPKE_KEY *key,
                                 const EVP_HPKE_KDF *kdf,
                                 const EVP_HPKE_AEAD *aead, const uint8_t *enc,
                                 size_t enc_len, const uint8_t *info,
                                 size_t info_len) {
  EVP_HPKE_CTX_zero(ctx);
  ctx->is_sender = 0;
  ctx->kem = key->kem;
  ctx->kdf = kdf;
  ctx->aead = aead;
  uint8_t shared_secret[MAX_SHARED_SECRET_LEN];
  size_t shared_secret_len;
  if (!key->kem->decap(key, shared_secret, &shared_secret_len, enc, enc_len) ||
      !hpke_key_schedule(ctx, HPKE_MODE_BASE, shared_secret, shared_secret_len,
                         info, info_len)) {
    EVP_HPKE_CTX_cleanup(ctx);
    return 0;
  }
  return 1;
}